

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void __thiscall
charls::process_transformed<charls::transform_hp3<unsigned_short>_>::encode_transform
          (process_transformed<charls::transform_hp3<unsigned_short>_> *this,void *source,
          void *destination,size_t pixel_count,size_t destination_stride)

{
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 aVar1;
  interleave_mode iVar2;
  int iVar3;
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *paVar4;
  size_t sVar5;
  
  if (this->parameters_->output_bgr == false) {
    iVar3 = this->frame_info_->component_count;
  }
  else {
    memcpy((this->temp_line_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start,source,pixel_count * 6);
    source = (this->temp_line_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar3 = this->frame_info_->component_count;
    if (pixel_count != 0) {
      paVar4 = &(((quad<unsigned_short> *)source)->super_triplet<unsigned_short>).field_2;
      sVar5 = pixel_count;
      do {
        aVar1 = paVar4[-2];
        paVar4[-2] = *paVar4;
        *paVar4 = aVar1;
        paVar4 = paVar4 + iVar3;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
  }
  if (iVar3 == 4) {
    iVar2 = this->parameters_->interleave_mode;
    if (iVar2 == Line) {
      transform_quad_to_line<charls::transform_hp3<unsigned_short>,unsigned_short>
                ((quad<unsigned_short> *)source,pixel_count,(unsigned_short *)destination,
                 destination_stride,(transform_hp3<unsigned_short> *)&this->field_0x50,this->mask_);
      return;
    }
    if (iVar2 == Sample) {
      transform_line<charls::transform_hp3<unsigned_short>,unsigned_short>
                ((quad<unsigned_short> *)destination,(quad<unsigned_short> *)source,pixel_count,
                 (transform_hp3<unsigned_short> *)&this->field_0x50,this->mask_);
      return;
    }
  }
  else if (iVar3 == 3) {
    if (this->parameters_->interleave_mode != Sample) {
      transform_triplet_to_line<charls::transform_hp3<unsigned_short>,unsigned_short>
                ((triplet<unsigned_short> *)source,pixel_count,(unsigned_short *)destination,
                 destination_stride,(transform_hp3<unsigned_short> *)&this->field_0x50,this->mask_);
      return;
    }
    transform_line<charls::transform_hp3<unsigned_short>,unsigned_short>
              ((triplet<unsigned_short> *)destination,(triplet<unsigned_short> *)source,pixel_count,
               (transform_hp3<unsigned_short> *)&this->field_0x50,this->mask_);
    return;
  }
  return;
}

Assistant:

void encode_transform(const void* source, void* destination, const size_t pixel_count,
                          const size_t destination_stride) noexcept
    {
        if (parameters_.output_bgr)
        {
            memcpy(temp_line_.data(), source, sizeof(triplet<size_type>) * pixel_count);
            transform_rgb_to_bgr(temp_line_.data(), frame_info_.component_count, pixel_count);
            source = temp_line_.data();
        }

        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else
            {
                transform_triplet_to_line(static_cast<const triplet<size_type>*>(source), pixel_count,
                                          static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_quad_to_line(static_cast<const quad<size_type>*>(source), pixel_count,
                                       static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
    }